

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O0

times * lest::for_test<lest::times>(tests *specification,texts *in,times *perform,int n)

{
  bool bVar1;
  uint uVar2;
  reference ptVar3;
  int in_ECX;
  fd_set *__exceptfds;
  times *in_RDX;
  fd_set *__writefds;
  timeval *in_R8;
  test *testing;
  iterator pos;
  int i;
  undefined7 in_stack_ffffffffffffff18;
  byte in_stack_ffffffffffffff1f;
  times *in_stack_ffffffffffffff20;
  times *in_stack_ffffffffffffff30;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffff68;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffff70;
  test *in_stack_ffffffffffffff98;
  times *in_stack_ffffffffffffffa0;
  iterator local_30;
  int local_28;
  int local_24;
  times *local_20;
  
  local_28 = 0;
  local_24 = in_ECX;
  local_20 = in_RDX;
  do {
    uVar2 = indefinite(local_24);
    __exceptfds = (fd_set *)(ulong)uVar2;
    if (uVar2 == 0 && local_24 <= local_28) {
      return local_20;
    }
    local_30 = std::vector<lest::test,_std::allocator<lest::test>_>::begin
                         ((vector<lest::test,_std::allocator<lest::test>_> *)
                          CONCAT17(in_stack_ffffffffffffff1f,in_stack_ffffffffffffff18));
    while( true ) {
      std::vector<lest::test,_std::allocator<lest::test>_>::end
                ((vector<lest::test,_std::allocator<lest::test>_> *)
                 CONCAT17(in_stack_ffffffffffffff1f,in_stack_ffffffffffffff18));
      bVar1 = __gnu_cxx::operator!=
                        ((__normal_iterator<lest::test_*,_std::vector<lest::test,_std::allocator<lest::test>_>_>
                          *)in_stack_ffffffffffffff20,
                         (__normal_iterator<lest::test_*,_std::vector<lest::test,_std::allocator<lest::test>_>_>
                          *)CONCAT17(in_stack_ffffffffffffff1f,in_stack_ffffffffffffff18));
      if (!bVar1) break;
      ptVar3 = __gnu_cxx::
               __normal_iterator<lest::test_*,_std::vector<lest::test,_std::allocator<lest::test>_>_>
               ::operator*(&stack0xffffffffffffffd0);
      std::__cxx11::string::string((string *)&stack0xffffffffffffffa0,(string *)ptVar3);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
      uVar2 = select((int)&stack0xffffffffffffffa0,(fd_set *)&stack0xffffffffffffff88,__writefds,
                     __exceptfds,in_R8);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)in_stack_ffffffffffffff30);
      std::__cxx11::string::~string((string *)&stack0xffffffffffffffa0);
      if ((uVar2 & 1) != 0) {
        in_stack_ffffffffffffff20 = local_20;
        test::test((test *)local_20,
                   (test *)CONCAT17(in_stack_ffffffffffffff1f,in_stack_ffffffffffffff18));
        in_stack_ffffffffffffff30 =
             times::operator()(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
        in_stack_ffffffffffffff1f = abort<lest::times>((times *)0x1086e3);
        test::~test((test *)0x1086f3);
        if ((in_stack_ffffffffffffff1f & 1) != 0) {
          return local_20;
        }
      }
      __gnu_cxx::
      __normal_iterator<lest::test_*,_std::vector<lest::test,_std::allocator<lest::test>_>_>::
      operator++(&stack0xffffffffffffffd0);
    }
    local_28 = local_28 + 1;
  } while( true );
}

Assistant:

Action & for_test( tests specification, texts in, Action & perform, int n = 1 )
{
    for ( int i = 0; indefinite( n ) || i < n; ++i )
    {
        for ( tests::iterator pos = specification.begin(); pos != specification.end() ; ++pos )
        {
            test & testing = *pos;

            if ( select( testing.name, in ) )
                if ( abort( perform( testing ) ) )
                    return perform;
        }
    }
    return perform;
}